

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O0

void __thiscall Wasm::WasmBinaryReader::ReadFunctionHeaders(WasmBinaryReader *this)

{
  WasmFunctionInfo *this_00;
  bool bVar1;
  uint32 uVar2;
  uint uVar3;
  uint32 uVar4;
  uint sourceContextId;
  LocalFunctionId functionId;
  FunctionBody *pFVar5;
  FunctionBodyReaderInfo info;
  byte *end;
  Type local_40;
  uint32 local_34;
  WasmFunctionInfo *pWStack_30;
  uint32 funcSize;
  WasmFunctionInfo *funcInfo;
  uint local_20;
  uint32 funcIndex;
  uint32 i;
  uint32 importCount;
  uint32 entries;
  uint32 len;
  WasmBinaryReader *this_local;
  
  _entries = this;
  i = LEB128<unsigned_int,32u>(this,&importCount);
  funcIndex = Js::WebAssemblyModule::GetImportedFunctionCount(this->m_module);
  uVar2 = Js::WebAssemblyModule::GetWasmFunctionCount(this->m_module);
  uVar4 = i;
  if ((uVar2 < funcIndex) ||
     (uVar2 = Js::WebAssemblyModule::GetWasmFunctionCount(this->m_module),
     uVar4 != uVar2 - funcIndex)) {
    ThrowDecodingError(this,L"Function signatures and function bodies count mismatch");
  }
  local_20 = 0;
  do {
    if (i <= local_20) {
      return;
    }
    funcInfo._4_4_ = local_20 + funcIndex;
    pWStack_30 = Js::WebAssemblyModule::GetWasmFunctionInfo(this->m_module,funcInfo._4_4_);
    uVar3 = LEB128<unsigned_int,32u>(this,&importCount);
    local_34 = uVar3;
    uVar4 = Limits::GetMaxFunctionSize();
    this_00 = pWStack_30;
    if (uVar4 < uVar3) {
      ThrowDecodingError(this,L"Function body too big");
    }
    FunctionBodyReaderInfo::FunctionBodyReaderInfo
              ((FunctionBodyReaderInfo *)&end,local_34,(long)this->m_pc - (long)this->m_start);
    info._4_4_ = 0;
    info.size = (uint)end;
    info.startOffset = local_40;
    WasmFunctionInfo::SetReaderInfo(this_00,info);
    CheckBytesLeft(this,local_34);
    pFVar5 = GetFunctionBody(this);
    if (pFVar5 == (FunctionBody *)0x0) {
      bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,WasmReaderPhase);
      if (bVar1) goto LAB_0160ab1d;
    }
    else {
      pFVar5 = GetFunctionBody(this);
      sourceContextId = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar5);
      pFVar5 = GetFunctionBody(this);
      functionId = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar5);
      bVar1 = Js::Phases::IsEnabled
                        ((Phases *)&DAT_01ec1678,WasmReaderPhase,sourceContextId,functionId);
      if (bVar1) {
LAB_0160ab1d:
        Output::Print(L"Function body header: index = %u, size = %u",(ulong)funcInfo._4_4_,
                      (ulong)local_34);
        Output::Print(L"\n");
        Output::Flush();
      }
    }
    this->m_pc = this->m_pc + local_34;
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

void WasmBinaryReader::ReadFunctionHeaders()
{
    uint32 len;
    uint32 entries = LEB128(len);
    uint32 importCount = m_module->GetImportedFunctionCount();
    if (m_module->GetWasmFunctionCount() < importCount ||
        entries != m_module->GetWasmFunctionCount() - importCount)
    {
        ThrowDecodingError(_u("Function signatures and function bodies count mismatch"));
    }

    for (uint32 i = 0; i < entries; ++i)
    {
        uint32 funcIndex = i + importCount;
        WasmFunctionInfo* funcInfo = m_module->GetWasmFunctionInfo(funcIndex);

        const uint32 funcSize = LEB128(len);
        if (funcSize > Limits::GetMaxFunctionSize())
        {
            ThrowDecodingError(_u("Function body too big"));
        }
        funcInfo->SetReaderInfo(FunctionBodyReaderInfo(funcSize, (m_pc - m_start)));
        CheckBytesLeft(funcSize);
        TRACE_WASM_DECODER(_u("Function body header: index = %u, size = %u"), funcIndex, funcSize);
        const byte* end = m_pc + funcSize;
        m_pc = end;
    }
}